

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssembly.cpp
# Opt level: O1

Var Js::WebAssembly::EntryInstantiate(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclableObject *importObject;
  Var pvVar5;
  WebAssemblyModule *pWVar6;
  WebAssemblyInstance *instance;
  WebAssemblyInstance *newValue;
  int in_stack_00000010;
  undefined1 local_58 [8];
  WebAssemblySource src;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x4b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d97c73;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  src.sourceInfo = (Utf8SourceInfo *)args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&src.sourceInfo,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)src.sourceInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x4c,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) goto LAB_00d97c73;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x4f,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d97c73:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((ulong)src.sourceInfo & 0xfffffe) != 0) {
    if (((uint)src.sourceInfo & 0xffffff) < 3) {
      importObject = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      importObject = (RecyclableObject *)Arguments::operator[]((Arguments *)&src.sourceInfo,2);
    }
    pvVar5 = Arguments::operator[]((Arguments *)&src.sourceInfo,1);
    bVar3 = VarIs<Js::WebAssemblyModule>(pvVar5);
    if (bVar3) {
      pvVar5 = Arguments::operator[]((Arguments *)&src.sourceInfo,1);
      pWVar6 = VarTo<Js::WebAssemblyModule>(pvVar5);
      instance = WebAssemblyInstance::CreateInstance(pWVar6,importObject);
    }
    else {
      pvVar5 = Arguments::operator[]((Arguments *)&src.sourceInfo,1);
      WebAssemblySource::WebAssemblySource((WebAssemblySource *)local_58,pvVar5,true,pSVar1);
      pWVar6 = WebAssemblyModule::CreateModule(pSVar1,(WebAssemblySource *)local_58);
      newValue = WebAssemblyInstance::CreateInstance(pWVar6,importObject);
      instance = (WebAssemblyInstance *)JavascriptOperators::NewJavascriptObjectNoArg(pSVar1);
      JavascriptOperators::OP_SetProperty
                (instance,0xe5,pWVar6,pSVar1,(PropertyValueInfo *)0x0,PropertyOperation_None,
                 (Var)0x0);
      JavascriptOperators::OP_SetProperty
                (instance,0xe6,newValue,pSVar1,(PropertyValueInfo *)0x0,PropertyOperation_None,
                 (Var)0x0);
    }
    pvVar5 = JavascriptPromise::CreateResolvedPromise(instance,pSVar1,(Var)0x0);
    return pvVar5;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e496,(PCWSTR)0x0);
}

Assistant:

Var WebAssembly::EntryInstantiate(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    Var resultObject = nullptr;
    try
    {
        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidInstantiateArgument);
        }

        Var importObject = scriptContext->GetLibrary()->GetUndefined();
        if (args.Info.Count >= 3)
        {
            importObject = args[2];
        }

        if (VarIs<WebAssemblyModule>(args[1]))
        {
            resultObject = WebAssemblyInstance::CreateInstance(VarTo<WebAssemblyModule>(args[1]), importObject);
        }
        else
        {
            WebAssemblySource src(args[1], true, scriptContext);
            WebAssemblyModule* wasmModule = WebAssemblyModule::CreateModule(scriptContext, &src);

            WebAssemblyInstance* instance = WebAssemblyInstance::CreateInstance(wasmModule, importObject);

            resultObject = JavascriptOperators::NewJavascriptObjectNoArg(scriptContext);

            JavascriptOperators::OP_SetProperty(resultObject, PropertyIds::module, wasmModule, scriptContext);
            JavascriptOperators::OP_SetProperty(resultObject, PropertyIds::instance, instance, scriptContext);
        }
        return JavascriptPromise::CreateResolvedPromise(resultObject, scriptContext);
    }
    catch (JavascriptException & e)
    {
        return JavascriptPromise::CreateRejectedPromise(e.GetAndClear()->GetThrownObject(scriptContext), scriptContext);
    }
}